

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

VkBuildAccelerationStructureFlagsKHR
Diligent::BuildASFlagsToVkBuildAccelerationStructureFlags(RAYTRACING_BUILD_AS_FLAGS Flags)

{
  VkBuildAccelerationStructureFlagsKHR VVar1;
  ulong uVar2;
  undefined7 in_register_00000039;
  byte bVar3;
  byte bVar4;
  string msg;
  string local_50;
  
  if ((int)CONCAT71(in_register_00000039,Flags) == 0) {
    VVar1 = 0;
  }
  else {
    uVar2 = CONCAT71(in_register_00000039,Flags) & 0xffffffff;
    VVar1 = 0;
    do {
      bVar3 = (byte)uVar2;
      bVar4 = -bVar3 & bVar3;
      switch(bVar4) {
      case 1:
        VVar1 = VVar1 | 1;
        break;
      case 2:
        VVar1 = VVar1 | 2;
        break;
      case 3:
      case 5:
      case 6:
      case 7:
switchD_00257d84_caseD_3:
        FormatString<char[22]>(&local_50,(char (*) [22])"unknown build AS flag");
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"BuildASFlagsToVkBuildAccelerationStructureFlags",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x6db);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        break;
      case 4:
        VVar1 = VVar1 | 4;
        break;
      case 8:
        VVar1 = VVar1 | 8;
        break;
      default:
        if (bVar4 != 0x10) goto switchD_00257d84_caseD_3;
        VVar1 = VVar1 | 0x10;
      }
      uVar2 = (ulong)(bVar4 ^ bVar3);
    } while (bVar4 != bVar3);
  }
  return VVar1;
}

Assistant:

VkBuildAccelerationStructureFlagsKHR BuildASFlagsToVkBuildAccelerationStructureFlags(RAYTRACING_BUILD_AS_FLAGS Flags)
{
    static_assert(RAYTRACING_BUILD_AS_FLAG_LAST == RAYTRACING_BUILD_AS_LOW_MEMORY,
                  "Please update the switch below to handle the new ray tracing build flag");

    VkBuildAccelerationStructureFlagsKHR Result = 0;
    while (Flags != RAYTRACING_BUILD_AS_NONE)
    {
        RAYTRACING_BUILD_AS_FLAGS FlagBit = ExtractLSB(Flags);
        switch (FlagBit)
        {
            // clang-format off
            case RAYTRACING_BUILD_AS_ALLOW_UPDATE:      Result |= VK_BUILD_ACCELERATION_STRUCTURE_ALLOW_UPDATE_BIT_KHR;      break;
            case RAYTRACING_BUILD_AS_ALLOW_COMPACTION:  Result |= VK_BUILD_ACCELERATION_STRUCTURE_ALLOW_COMPACTION_BIT_KHR;  break;
            case RAYTRACING_BUILD_AS_PREFER_FAST_TRACE: Result |= VK_BUILD_ACCELERATION_STRUCTURE_PREFER_FAST_TRACE_BIT_KHR; break;
            case RAYTRACING_BUILD_AS_PREFER_FAST_BUILD: Result |= VK_BUILD_ACCELERATION_STRUCTURE_PREFER_FAST_BUILD_BIT_KHR; break;
            case RAYTRACING_BUILD_AS_LOW_MEMORY:        Result |= VK_BUILD_ACCELERATION_STRUCTURE_LOW_MEMORY_BIT_KHR;        break;
            // clang-format on
            default: UNEXPECTED("unknown build AS flag");
        }
    }
    return Result;
}